

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_common.h
# Opt level: O0

void segfeatures_copy(segmentation *dst,segmentation *src)

{
  int j;
  int i;
  segmentation *src_local;
  segmentation *dst_local;
  
  for (i = 0; i < 8; i = i + 1) {
    dst->feature_mask[i] = src->feature_mask[i];
    for (j = 0; j < 8; j = j + 1) {
      dst->feature_data[i][j] = src->feature_data[i][j];
    }
  }
  dst->segid_preskip = src->segid_preskip;
  dst->last_active_segid = src->last_active_segid;
  return;
}

Assistant:

static inline void segfeatures_copy(struct segmentation *dst,
                                    const struct segmentation *src) {
  int i, j;
  for (i = 0; i < MAX_SEGMENTS; i++) {
    dst->feature_mask[i] = src->feature_mask[i];
    for (j = 0; j < SEG_LVL_MAX; j++) {
      dst->feature_data[i][j] = src->feature_data[i][j];
    }
  }
  dst->segid_preskip = src->segid_preskip;
  dst->last_active_segid = src->last_active_segid;
}